

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

int __thiscall ON_PolyCurve::Degree(ON_PolyCurve *this)

{
  int iVar1;
  int iVar2;
  ON_Curve **ppOVar3;
  int local_24;
  int d;
  int segment_index;
  int span_degree;
  int segment_count;
  ON_PolyCurve *this_local;
  
  iVar1 = Count(this);
  d = 0;
  local_24 = 0;
  while( true ) {
    if (iVar1 <= local_24) {
      return d;
    }
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_24);
    if (*ppOVar3 == (ON_Curve *)0x0) break;
    ppOVar3 = ON_SimpleArray<ON_Curve_*>::operator[]
                        (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_24);
    iVar2 = (*((*ppOVar3)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x2c])();
    if (iVar2 < 1) {
      return 0;
    }
    if (d < iVar2) {
      d = iVar2;
    }
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

int ON_PolyCurve::Degree() const
{
  const int segment_count = Count();
  int span_degree = 0;
  int segment_index, d;
  for ( segment_index = 0; segment_index < segment_count; segment_index++  ) {
    if ( !m_segment[segment_index] )
      return false;
    d = m_segment[segment_index]->Degree();
    if ( d <= 0 )
      return 0;
    if ( d > span_degree )
      span_degree = d;
  }
  return span_degree;
}